

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O2

bool slang::syntax::SyntaxFacts::isAllowedInGenerate(SyntaxKind kind)

{
  bool bVar1;
  
  if ((kind == DefParam) || (kind == PrimitiveInstantiation)) {
    return true;
  }
  if ((((0x2c < kind - FinalBlock) ||
       ((0x100082104001U >> ((ulong)(kind - FinalBlock) & 0x3f) & 1) == 0)) &&
      ((0x37 < kind - BindDirective ||
       ((0x80004000400801U >> ((ulong)(kind - BindDirective) & 0x3f) & 1) == 0)))) &&
     (((3 < kind - AlwaysBlock && (kind != LoopGenerate)) && (kind != NetAlias)))) {
    bVar1 = isModuleCommonDecl(kind);
    return bVar1;
  }
  return true;
}

Assistant:

bool SyntaxFacts::isAllowedInGenerate(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::DefParam:
        case SyntaxKind::PrimitiveInstantiation:
            return true;
        default:
            return isModuleCommonItem(kind);
    }
}